

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void LoadFunction(LoadState *S,Proto *fp,TString *psource)

{
  SharedProto *pSVar1;
  lu_byte lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  TString *pTVar6;
  Instruction *b;
  TValue *pTVar7;
  lua_Integer lVar8;
  Upvaldesc *pUVar9;
  Proto **ppPVar10;
  Proto *pPVar11;
  int *b_00;
  LocVar *pLVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  lua_Number lVar16;
  
  pSVar1 = fp->sp;
  pTVar6 = LoadString(S);
  if (pTVar6 != (TString *)0x0) {
    psource = pTVar6;
  }
  pSVar1->source = psource;
  iVar4 = LoadInt(S);
  pSVar1->linedefined = iVar4;
  iVar4 = LoadInt(S);
  pSVar1->lastlinedefined = iVar4;
  lVar2 = LoadByte(S);
  pSVar1->numparams = lVar2;
  lVar2 = LoadByte(S);
  pSVar1->is_vararg = lVar2;
  lVar2 = LoadByte(S);
  pSVar1->maxstacksize = lVar2;
  iVar4 = LoadInt(S);
  lVar13 = 0;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar4 * 4);
  pSVar1->code = b;
  pSVar1->sizecode = iVar4;
  LoadBlock(S,b,(long)iVar4 * 4);
  uVar5 = LoadInt(S);
  pTVar7 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
  fp->k = pTVar7;
  fp->sp->sizek = uVar5;
  uVar14 = 0;
  if (0 < (int)uVar5) {
    uVar14 = (ulong)uVar5;
  }
  for (; uVar14 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
    *(undefined4 *)((long)&pTVar7->tt_ + lVar13) = 0;
  }
  lVar13 = 0;
  do {
    if (uVar14 * 0x10 == lVar13) {
      uVar5 = LoadInt(S);
      lVar13 = 0;
      pUVar9 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
      pSVar1->upvalues = pUVar9;
      pSVar1->sizeupvalues = uVar5;
      uVar14 = 0;
      if (0 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      for (; uVar14 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        *(undefined8 *)((long)&pUVar9->name + lVar13) = 0;
      }
      for (lVar13 = 0; uVar14 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        lVar2 = LoadByte(S);
        (&pSVar1->upvalues->instack)[lVar13] = lVar2;
        lVar2 = LoadByte(S);
        (&pSVar1->upvalues->idx)[lVar13] = lVar2;
      }
      uVar5 = LoadInt(S);
      uVar14 = 0;
      ppPVar10 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 * 8);
      fp->p = ppPVar10;
      fp->sp->sizep = uVar5;
      uVar15 = 0;
      if (0 < (int)uVar5) {
        uVar15 = (ulong)uVar5;
      }
      for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        fp->p[uVar14] = (Proto *)0x0;
      }
      for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        pPVar11 = luaF_newproto(S->L,(SharedProto *)0x0);
        fp->p[uVar14] = pPVar11;
        LoadFunction(S,fp->p[uVar14],fp->sp->source);
      }
      iVar4 = LoadInt(S);
      lVar13 = 0;
      b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar4 * 4);
      pSVar1->lineinfo = b_00;
      pSVar1->sizelineinfo = iVar4;
      LoadBlock(S,b_00,(long)iVar4 * 4);
      uVar5 = LoadInt(S);
      pLVar12 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
      pSVar1->locvars = pLVar12;
      pSVar1->sizelocvars = uVar5;
      uVar14 = 0;
      if (0 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      for (; uVar14 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        *(undefined8 *)((long)&pLVar12->varname + lVar13) = 0;
      }
      for (lVar13 = 0; uVar14 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        pTVar6 = LoadString(S);
        *(TString **)((long)&pSVar1->locvars->varname + lVar13) = pTVar6;
        iVar4 = LoadInt(S);
        *(int *)((long)&pSVar1->locvars->startpc + lVar13) = iVar4;
        iVar4 = LoadInt(S);
        *(int *)((long)&pSVar1->locvars->endpc + lVar13) = iVar4;
      }
      uVar5 = LoadInt(S);
      uVar15 = 0;
      uVar14 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar14 = uVar15;
      }
      for (; uVar14 * 0x10 != uVar15; uVar15 = uVar15 + 0x10) {
        pTVar6 = LoadString(S);
        *(TString **)((long)&pSVar1->upvalues->name + uVar15) = pTVar6;
      }
      return;
    }
    pTVar7 = fp->k;
    bVar3 = LoadByte(S);
    uVar5 = (uint)bVar3;
    switch(bVar3) {
    case 0:
      break;
    case 1:
      bVar3 = LoadByte(S);
      *(uint *)((long)&pTVar7->value_ + lVar13) = (uint)bVar3;
      uVar5 = 1;
      break;
    case 2:
      goto switchD_0013fe3e_caseD_2;
    case 3:
      lVar16 = LoadNumber(S);
      *(lua_Number *)((long)&pTVar7->value_ + lVar13) = lVar16;
      uVar5 = 3;
      break;
    case 4:
switchD_0013fe3e_caseD_4:
      pTVar6 = LoadString(S);
      *(TString **)((long)&pTVar7->value_ + lVar13) = pTVar6;
      uVar5 = pTVar6->tt | 0x40;
      break;
    default:
      if (bVar3 == 0x13) {
        lVar8 = LoadInteger(S);
        *(lua_Integer *)((long)&pTVar7->value_ + lVar13) = lVar8;
        uVar5 = 0x13;
        break;
      }
      if (bVar3 == 0x14) goto switchD_0013fe3e_caseD_4;
      goto switchD_0013fe3e_caseD_2;
    }
    *(uint *)((long)&pTVar7->tt_ + lVar13) = uVar5;
switchD_0013fe3e_caseD_2:
    lVar13 = lVar13 + 0x10;
  } while( true );
}

Assistant:

static void LoadFunction (LoadState *S, Proto *fp, TString *psource) {
  SharedProto *f = fp->sp;
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, fp);
  LoadUpvalues(S, f);
  LoadProtos(S, fp);
  LoadDebug(S, f);
}